

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O2

qsizetype cost(QPixmap *pixmap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = QPixmap::width(pixmap);
  iVar2 = QPixmap::height(pixmap);
  iVar3 = QPixmap::depth(pixmap);
  lVar4 = ((long)iVar3 * (long)iVar2 * (long)iVar1) / 0x2000;
  if (lVar4 < 2) {
    lVar4 = 1;
  }
  return lVar4;
}

Assistant:

static inline qsizetype cost(const QPixmap &pixmap)
{
    // make sure to do a 64bit calculation; qsizetype might be smaller
    const qint64 costKb = static_cast<qint64>(pixmap.width())
                        * pixmap.height() * pixmap.depth() / (8 * 1024);
    const qint64 costMax = std::numeric_limits<qsizetype>::max();
    // a small pixmap should have at least a cost of 1(kb)
    return static_cast<qsizetype>(qBound(1LL, costKb, costMax));
}